

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildcard.c
# Opt level: O2

_Bool wc_unescape(char *output,char *wildcard)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  
LAB_0013472c:
  do {
    pbVar3 = (byte *)output;
    wildcard = (char *)((byte *)wildcard + 1);
    do {
      bVar1 = ((byte *)wildcard)[-1];
      if (bVar1 == 0) {
        if (pbVar3 != (byte *)0x0) {
          *pbVar3 = 0;
        }
LAB_00134783:
        return bVar1 == 0;
      }
      uVar2 = bVar1 - 0x2a;
      if (0x33 < uVar2) {
LAB_00134767:
        output = (char *)(byte *)0x0;
        if (pbVar3 == (byte *)0x0) goto LAB_0013472c;
        *pbVar3 = bVar1;
        goto LAB_00134773;
      }
      if ((ulong)uVar2 != 0x32) {
        if ((0xa000000200001U >> ((ulong)uVar2 & 0x3f) & 1) != 0) goto LAB_00134783;
        goto LAB_00134767;
      }
      bVar1 = *wildcard;
      wildcard = (char *)((byte *)wildcard + 1);
    } while (bVar1 == 0);
    output = (char *)(byte *)0x0;
    if (pbVar3 != (byte *)0x0) {
      *pbVar3 = bVar1;
LAB_00134773:
      output = (char *)(pbVar3 + 1);
    }
  } while( true );
}

Assistant:

bool wc_unescape(char *output, const char *wildcard)
{
    while (*wildcard) {
        if (*wildcard == '\\') {
            wildcard++;
            /* We are lenient about trailing backslashes in non-wildcards. */
            if (*wildcard) {
                if (output)
                    *output++ = *wildcard;
                wildcard++;
            }
        } else if (*wildcard == '*' || *wildcard == '?' ||
                   *wildcard == '[' || *wildcard == ']') {
            return false;              /* it's a wildcard! */
        } else {
            if (output)
                *output++ = *wildcard;
            wildcard++;
        }
    }
    if (output)
        *output = '\0';
    return true;                       /* it's clean */
}